

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_collector.hpp
# Opt level: O2

void __thiscall
duckdb::BatchCollectorLocalState::~BatchCollectorLocalState(BatchCollectorLocalState *this)

{
  ~BatchCollectorLocalState(this);
  operator_delete(this);
  return;
}

Assistant:

BatchCollectorLocalState(ClientContext &context, const PhysicalBatchCollector &op) : data(context, op.types) {
	}